

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arraylist.c
# Opt level: O0

array_list * array_list_new2(array_list_free_fn *free_fn,int initial_size)

{
  void *pvVar1;
  array_list *arr;
  int initial_size_local;
  array_list_free_fn *free_fn_local;
  
  if ((initial_size < 0) || (0x1ffffffffffffffe < (ulong)(long)initial_size)) {
    free_fn_local = (array_list_free_fn *)0x0;
  }
  else {
    free_fn_local = (array_list_free_fn *)malloc(0x20);
    if (free_fn_local == (array_list_free_fn *)0x0) {
      free_fn_local = (array_list_free_fn *)0x0;
    }
    else {
      *(long *)(free_fn_local + 0x10) = (long)initial_size;
      *(undefined8 *)(free_fn_local + 8) = 0;
      *(array_list_free_fn **)(free_fn_local + 0x18) = free_fn;
      pvVar1 = malloc(*(long *)(free_fn_local + 0x10) << 3);
      *(void **)free_fn_local = pvVar1;
      if (pvVar1 == (void *)0x0) {
        free(free_fn_local);
        free_fn_local = (array_list_free_fn *)0x0;
      }
    }
  }
  return (array_list *)free_fn_local;
}

Assistant:

struct array_list *array_list_new2(array_list_free_fn *free_fn, int initial_size)
{
	struct array_list *arr;

	if (initial_size < 0 || (size_t)initial_size >= SIZE_T_MAX / sizeof(void *))
		return NULL;
	arr = (struct array_list *)malloc(sizeof(struct array_list));
	if (!arr)
		return NULL;
	arr->size = initial_size;
	arr->length = 0;
	arr->free_fn = free_fn;
	if (!(arr->array = (void **)malloc(arr->size * sizeof(void *))))
	{
		free(arr);
		return NULL;
	}
	return arr;
}